

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3GetToken(uchar *z,int *tokenType)

{
  uchar uVar1;
  uint uVar2;
  int iVar3;
  bool bVar4;
  int local_30;
  int n;
  int delim;
  int c;
  int i;
  int *tokenType_local;
  uchar *z_local;
  
  switch("\x1b\x1b\x1b\x1b\x1b\x1b\x1b\x1b\x1b\a\a\x1b\a\a\x1b\x1b\x1b\x1b\x1b\x1b\x1b\x1b\x1b\x1b\x1b\x1b\x1b\x1b\x1b\x1b\x1b\x1b\a\x0f\b\x05\x04\x16\x18\b\x11\x12\x15\x14\x17\v\x1a\x10\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x05\x13\f\x0e\r\x06\x05\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01"
         [*z]) {
  case '\0':
    if (z[1] == '\'') {
      *tokenType = 0x85;
      delim = 2;
      while ((""[z[delim]] & 8) != 0) {
        delim = delim + 1;
      }
      if ((z[delim] != '\'') || (delim % 2 != 0)) {
        *tokenType = 0xa4;
        while( true ) {
          bVar4 = false;
          if (z[delim] != '\0') {
            bVar4 = z[delim] != '\'';
          }
          if (!bVar4) break;
          delim = delim + 1;
        }
      }
      if (z[delim] != '\0') {
        delim = delim + 1;
      }
      return delim;
    }
  case '\x02':
    delim = 1;
LAB_0016a91e:
    while ((""[z[delim]] & 0x46) != 0) {
      delim = delim + 1;
    }
    *tokenType = 0x1b;
    z_local._4_4_ = delim;
    break;
  case '\x01':
    delim = 1;
    while ("\x1b\x1b\x1b\x1b\x1b\x1b\x1b\x1b\x1b\a\a\x1b\a\a\x1b\x1b\x1b\x1b\x1b\x1b\x1b\x1b\x1b\x1b\x1b\x1b\x1b\x1b\x1b\x1b\x1b\x1b\a\x0f\b\x05\x04\x16\x18\b\x11\x12\x15\x14\x17\v\x1a\x10\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x05\x13\f\x0e\r\x06\x05\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01"
           [z[delim]] < 2) {
      delim = delim + 1;
    }
    if ((""[z[delim]] & 0x46) == 0) {
      *tokenType = 0x1b;
      iVar3 = keywordCode((char *)z,delim,tokenType);
      return iVar3;
    }
    delim = delim + 1;
    goto LAB_0016a91e;
  case '\x04':
  case '\x05':
    local_30 = 0;
    *tokenType = 0x87;
    delim = 1;
    while (uVar2 = (uint)z[delim], uVar2 != 0) {
      if ((""[uVar2] & 0x46) == 0) {
        if ((uVar2 == 0x28) && (iVar3 = delim, 0 < local_30)) goto LAB_0016a6d8;
        if ((uVar2 != 0x3a) || (z[delim + 1] != ':')) break;
        delim = delim + 1;
      }
      else {
        local_30 = local_30 + 1;
      }
      delim = delim + 1;
    }
    goto LAB_0016a785;
  case '\x06':
    *tokenType = 0x87;
    delim = 1;
    while ((""[z[delim]] & 4) != 0) {
      delim = delim + 1;
    }
    z_local._4_4_ = delim;
    break;
  case '\a':
    delim = 1;
    while ((""[z[delim]] & 1) != 0) {
      delim = delim + 1;
    }
    *tokenType = 0xa3;
    z_local._4_4_ = delim;
    break;
  case '\b':
    for (delim = 1; uVar1 = z[delim], uVar1 != '\0'; delim = delim + 1) {
      if (uVar1 == *z) {
        if (z[delim + 1] != *z) break;
        delim = delim + 1;
      }
    }
    if (uVar1 == '\'') {
      *tokenType = 0x61;
      z_local._4_4_ = delim + 1;
    }
    else if (uVar1 == '\0') {
      *tokenType = 0xa4;
      z_local._4_4_ = delim;
    }
    else {
      *tokenType = 0x1b;
      z_local._4_4_ = delim + 1;
    }
    break;
  case '\t':
    delim = 1;
    n = (int)*z;
    while( true ) {
      bVar4 = false;
      if (n != 0x5d) {
        n = (int)z[delim];
        bVar4 = n != 0;
      }
      if (!bVar4) break;
      delim = delim + 1;
    }
    iVar3 = 0xa4;
    if (n == 0x5d) {
      iVar3 = 0x1b;
    }
    *tokenType = iVar3;
    z_local._4_4_ = delim;
    break;
  case '\n':
    if (z[1] == '|') {
      *tokenType = 0x5d;
      z_local._4_4_ = 2;
    }
    else {
      *tokenType = 0x55;
      z_local._4_4_ = 1;
    }
    break;
  case '\v':
    if (z[1] == '-') {
      delim = 2;
      while (z[delim] != '\0' && z[delim] != '\n') {
        delim = delim + 1;
      }
      *tokenType = 0xa3;
      z_local._4_4_ = delim;
    }
    else {
      *tokenType = 0x59;
      z_local._4_4_ = 1;
    }
    break;
  case '\f':
    uVar1 = z[1];
    if (uVar1 == '=') {
      *tokenType = 0x50;
      z_local._4_4_ = 2;
    }
    else if (uVar1 == '>') {
      *tokenType = 0x4d;
      z_local._4_4_ = 2;
    }
    else if (uVar1 == '<') {
      *tokenType = 0x56;
      z_local._4_4_ = 2;
    }
    else {
      *tokenType = 0x51;
      z_local._4_4_ = 1;
    }
    break;
  case '\r':
    if (z[1] == '=') {
      *tokenType = 0x52;
      z_local._4_4_ = 2;
    }
    else if (z[1] == '>') {
      *tokenType = 0x57;
      z_local._4_4_ = 2;
    }
    else {
      *tokenType = 0x4f;
      z_local._4_4_ = 1;
    }
    break;
  case '\x0e':
    *tokenType = 0x4e;
    z_local._4_4_ = (z[1] == '=') + 1;
    break;
  case '\x0f':
    if (z[1] == '=') {
      *tokenType = 0x4d;
      z_local._4_4_ = 2;
    }
    else {
      *tokenType = 0xa4;
      z_local._4_4_ = 1;
    }
    break;
  case '\x10':
    if ((z[1] == '*') && (z[2] != '\0')) {
      delim = 3;
      n = (int)z[2];
      while( true ) {
        if ((n != 0x2a) || (bVar4 = false, z[delim] != '/')) {
          n = (int)z[delim];
          bVar4 = n != 0;
        }
        if (!bVar4) break;
        delim = delim + 1;
      }
      if (n != 0) {
        delim = delim + 1;
      }
      *tokenType = 0xa3;
      z_local._4_4_ = delim;
    }
    else {
      *tokenType = 0x5b;
      z_local._4_4_ = 1;
    }
    break;
  case '\x11':
    *tokenType = 0x16;
    z_local._4_4_ = 1;
    break;
  case '\x12':
    *tokenType = 0x17;
    z_local._4_4_ = 1;
    break;
  case '\x13':
    *tokenType = 1;
    z_local._4_4_ = 1;
    break;
  case '\x14':
    *tokenType = 0x58;
    z_local._4_4_ = 1;
    break;
  case '\x15':
    *tokenType = 0x5a;
    z_local._4_4_ = 1;
    break;
  case '\x16':
    *tokenType = 0x5c;
    z_local._4_4_ = 1;
    break;
  case '\x17':
    *tokenType = 0x1a;
    z_local._4_4_ = 1;
    break;
  case '\x18':
    *tokenType = 0x54;
    z_local._4_4_ = 1;
    break;
  case '\x19':
    *tokenType = 0x5f;
    z_local._4_4_ = 1;
    break;
  case '\x1a':
    if ((""[z[1]] & 4) == 0) {
      *tokenType = 0x7a;
      return 1;
    }
  case '\x03':
    *tokenType = 0x86;
    if ((*z == '0') && (((z[1] == 'x' || (z[1] == 'X')) && ((""[z[2]] & 8) != 0)))) {
      delim = 3;
      while ((""[z[delim]] & 8) != 0) {
        delim = delim + 1;
      }
      z_local._4_4_ = delim;
    }
    else {
      delim = 0;
      while ((""[z[delim]] & 4) != 0) {
        delim = delim + 1;
      }
      if (z[delim] == '.') {
        do {
          delim = delim + 1;
        } while ((""[z[delim]] & 4) != 0);
        *tokenType = 0x84;
      }
      if (((z[delim] == 'e') || (z[delim] == 'E')) &&
         (((""[z[delim + 1]] & 4) != 0 ||
          (((z[delim + 1] == '+' || (z[delim + 1] == '-')) && ((""[z[delim + 2]] & 4) != 0)))))) {
        delim = delim + 2;
        while ((""[z[delim]] & 4) != 0) {
          delim = delim + 1;
        }
        *tokenType = 0x84;
      }
      while ((""[z[delim]] & 0x46) != 0) {
        *tokenType = 0xa4;
        delim = delim + 1;
      }
      z_local._4_4_ = delim;
    }
    break;
  default:
    *tokenType = 0xa4;
    z_local._4_4_ = 1;
  }
  return z_local._4_4_;
LAB_0016a6d8:
  do {
    delim = iVar3;
    iVar3 = delim + 1;
    uVar2 = (uint)z[iVar3];
    bVar4 = false;
    if ((uVar2 != 0) && (bVar4 = false, (""[uVar2] & 1) == 0)) {
      bVar4 = uVar2 != 0x29;
    }
  } while (bVar4);
  if (uVar2 == 0x29) {
    delim = delim + 2;
  }
  else {
    *tokenType = 0xa4;
    delim = iVar3;
  }
LAB_0016a785:
  if (local_30 == 0) {
    *tokenType = 0xa4;
  }
  return delim;
}

Assistant:

SQLITE_PRIVATE int sqlite3GetToken(const unsigned char *z, int *tokenType){
  int i, c;
  switch( aiClass[*z] ){  /* Switch on the character-class of the first byte
                          ** of the token. See the comment on the CC_ defines
                          ** above. */
    case CC_SPACE: {
      testcase( z[0]==' ' );
      testcase( z[0]=='\t' );
      testcase( z[0]=='\n' );
      testcase( z[0]=='\f' );
      testcase( z[0]=='\r' );
      for(i=1; sqlite3Isspace(z[i]); i++){}
      *tokenType = TK_SPACE;
      return i;
    }
    case CC_MINUS: {
      if( z[1]=='-' ){
        for(i=2; (c=z[i])!=0 && c!='\n'; i++){}
        *tokenType = TK_SPACE;   /* IMP: R-22934-25134 */
        return i;
      }
      *tokenType = TK_MINUS;
      return 1;
    }
    case CC_LP: {
      *tokenType = TK_LP;
      return 1;
    }
    case CC_RP: {
      *tokenType = TK_RP;
      return 1;
    }
    case CC_SEMI: {
      *tokenType = TK_SEMI;
      return 1;
    }
    case CC_PLUS: {
      *tokenType = TK_PLUS;
      return 1;
    }
    case CC_STAR: {
      *tokenType = TK_STAR;
      return 1;
    }
    case CC_SLASH: {
      if( z[1]!='*' || z[2]==0 ){
        *tokenType = TK_SLASH;
        return 1;
      }
      for(i=3, c=z[2]; (c!='*' || z[i]!='/') && (c=z[i])!=0; i++){}
      if( c ) i++;
      *tokenType = TK_SPACE;   /* IMP: R-22934-25134 */
      return i;
    }
    case CC_PERCENT: {
      *tokenType = TK_REM;
      return 1;
    }
    case CC_EQ: {
      *tokenType = TK_EQ;
      return 1 + (z[1]=='=');
    }
    case CC_LT: {
      if( (c=z[1])=='=' ){
        *tokenType = TK_LE;
        return 2;
      }else if( c=='>' ){
        *tokenType = TK_NE;
        return 2;
      }else if( c=='<' ){
        *tokenType = TK_LSHIFT;
        return 2;
      }else{
        *tokenType = TK_LT;
        return 1;
      }
    }
    case CC_GT: {
      if( (c=z[1])=='=' ){
        *tokenType = TK_GE;
        return 2;
      }else if( c=='>' ){
        *tokenType = TK_RSHIFT;
        return 2;
      }else{
        *tokenType = TK_GT;
        return 1;
      }
    }
    case CC_BANG: {
      if( z[1]!='=' ){
        *tokenType = TK_ILLEGAL;
        return 1;
      }else{
        *tokenType = TK_NE;
        return 2;
      }
    }
    case CC_PIPE: {
      if( z[1]!='|' ){
        *tokenType = TK_BITOR;
        return 1;
      }else{
        *tokenType = TK_CONCAT;
        return 2;
      }
    }
    case CC_COMMA: {
      *tokenType = TK_COMMA;
      return 1;
    }
    case CC_AND: {
      *tokenType = TK_BITAND;
      return 1;
    }
    case CC_TILDA: {
      *tokenType = TK_BITNOT;
      return 1;
    }
    case CC_QUOTE: {
      int delim = z[0];
      testcase( delim=='`' );
      testcase( delim=='\'' );
      testcase( delim=='"' );
      for(i=1; (c=z[i])!=0; i++){
        if( c==delim ){
          if( z[i+1]==delim ){
            i++;
          }else{
            break;
          }
        }
      }
      if( c=='\'' ){
        *tokenType = TK_STRING;
        return i+1;
      }else if( c!=0 ){
        *tokenType = TK_ID;
        return i+1;
      }else{
        *tokenType = TK_ILLEGAL;
        return i;
      }
    }
    case CC_DOT: {
#ifndef SQLITE_OMIT_FLOATING_POINT
      if( !sqlite3Isdigit(z[1]) )
#endif
      {
        *tokenType = TK_DOT;
        return 1;
      }
      /* If the next character is a digit, this is a floating point
      ** number that begins with ".".  Fall thru into the next case */
    }
    case CC_DIGIT: {
      testcase( z[0]=='0' );  testcase( z[0]=='1' );  testcase( z[0]=='2' );
      testcase( z[0]=='3' );  testcase( z[0]=='4' );  testcase( z[0]=='5' );
      testcase( z[0]=='6' );  testcase( z[0]=='7' );  testcase( z[0]=='8' );
      testcase( z[0]=='9' );
      *tokenType = TK_INTEGER;
#ifndef SQLITE_OMIT_HEX_INTEGER
      if( z[0]=='0' && (z[1]=='x' || z[1]=='X') && sqlite3Isxdigit(z[2]) ){
        for(i=3; sqlite3Isxdigit(z[i]); i++){}
        return i;
      }
#endif
      for(i=0; sqlite3Isdigit(z[i]); i++){}
#ifndef SQLITE_OMIT_FLOATING_POINT
      if( z[i]=='.' ){
        i++;
        while( sqlite3Isdigit(z[i]) ){ i++; }
        *tokenType = TK_FLOAT;
      }
      if( (z[i]=='e' || z[i]=='E') &&
           ( sqlite3Isdigit(z[i+1]) 
            || ((z[i+1]=='+' || z[i+1]=='-') && sqlite3Isdigit(z[i+2]))
           )
      ){
        i += 2;
        while( sqlite3Isdigit(z[i]) ){ i++; }
        *tokenType = TK_FLOAT;
      }
#endif
      while( IdChar(z[i]) ){
        *tokenType = TK_ILLEGAL;
        i++;
      }
      return i;
    }
    case CC_QUOTE2: {
      for(i=1, c=z[0]; c!=']' && (c=z[i])!=0; i++){}
      *tokenType = c==']' ? TK_ID : TK_ILLEGAL;
      return i;
    }
    case CC_VARNUM: {
      *tokenType = TK_VARIABLE;
      for(i=1; sqlite3Isdigit(z[i]); i++){}
      return i;
    }
    case CC_DOLLAR:
    case CC_VARALPHA: {
      int n = 0;
      testcase( z[0]=='$' );  testcase( z[0]=='@' );
      testcase( z[0]==':' );  testcase( z[0]=='#' );
      *tokenType = TK_VARIABLE;
      for(i=1; (c=z[i])!=0; i++){
        if( IdChar(c) ){
          n++;
#ifndef SQLITE_OMIT_TCL_VARIABLE
        }else if( c=='(' && n>0 ){
          do{
            i++;
          }while( (c=z[i])!=0 && !sqlite3Isspace(c) && c!=')' );
          if( c==')' ){
            i++;
          }else{
            *tokenType = TK_ILLEGAL;
          }
          break;
        }else if( c==':' && z[i+1]==':' ){
          i++;
#endif
        }else{
          break;
        }
      }
      if( n==0 ) *tokenType = TK_ILLEGAL;
      return i;
    }
    case CC_KYWD: {
      for(i=1; aiClass[z[i]]<=CC_KYWD; i++){}
      if( IdChar(z[i]) ){
        /* This token started out using characters that can appear in keywords,
        ** but z[i] is a character not allowed within keywords, so this must
        ** be an identifier instead */
        i++;
        break;
      }
      *tokenType = TK_ID;
      return keywordCode((char*)z, i, tokenType);
    }
    case CC_X: {
#ifndef SQLITE_OMIT_BLOB_LITERAL
      testcase( z[0]=='x' ); testcase( z[0]=='X' );
      if( z[1]=='\'' ){
        *tokenType = TK_BLOB;
        for(i=2; sqlite3Isxdigit(z[i]); i++){}
        if( z[i]!='\'' || i%2 ){
          *tokenType = TK_ILLEGAL;
          while( z[i] && z[i]!='\'' ){ i++; }
        }
        if( z[i] ) i++;
        return i;
      }
#endif
      /* If it is not a BLOB literal, then it must be an ID, since no
      ** SQL keywords start with the letter 'x'.  Fall through */
    }
    case CC_ID: {
      i = 1;
      break;
    }
    default: {
      *tokenType = TK_ILLEGAL;
      return 1;
    }
  }
  while( IdChar(z[i]) ){ i++; }
  *tokenType = TK_ID;
  return i;
}